

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

dxil_spv_result
dxil_spv_converter_add_option(dxil_spv_converter converter,dxil_spv_option_base *option)

{
  dxil_spv_bool dVar1;
  OptionMaxTessFactor local_4a0;
  OptionShaderDemoteToHelper local_498;
  dxil_spv_option_max_tess_factor *tess_factor;
  OptionMaxTessFactor helper_43;
  dxil_spv_option_extended_robustness *robust_2;
  OptionExtendedRobustness helper_42;
  dxil_spv_option_shader_quirk *quirk;
  OptionShaderQuirk helper_41;
  dxil_spv_option_instruction_instrumentation *inst;
  OptionInstructionInstrumentation helper_40;
  dxil_spv_option_compute_shader_derivatives *deriv_1;
  OptionComputeShaderDerivatives helper_39;
  dxil_spv_option_driver_version *ver;
  undefined4 local_3e8;
  OptionDriverVersion helper_38;
  dxil_spv_option_raw_access_chains_nv *chain;
  OptionRawAccessChainsNV helper_37;
  dxil_spv_option_quad_control_reconvergence *quad;
  OptionQuadControlReconvergence helper_36;
  dxil_spv_option_compute_shader_derivatives_nv *deriv;
  OptionComputeShaderDerivativesNV helper_35;
  dxil_spv_option_descriptor_heap_robustness *rob;
  OptionDescriptorHeapRobustness helper_34;
  dxil_spv_option_subgroup_properties *sub;
  undefined4 local_368;
  OptionSubgroupProperties helper_33;
  dxil_spv_option_branch_control *branch;
  undefined1 local_348;
  undefined1 local_347;
  undefined1 local_346;
  undefined1 local_345;
  OptionBranchControl helper_32;
  dxil_spv_option_opacity_micromap *omm;
  OptionOpacityMicromap helper_31;
  dxil_spv_option_sample_grad_optimization_control *precise_1;
  OptionSampleGradOptimizationControl helper_30;
  dxil_spv_option_precise_control *precise;
  OptionPreciseControl helper_29;
  dxil_spv_option_dead_code_eliminate *eliminate;
  OptionDeadCodeEliminate helper_28;
  dxil_spv_option_subgroup_partitioned_nv *partitioned;
  OptionSubgroupPartitionedNV helper_27;
  dxil_spv_option_strict_helper_lane_wave_ops *strict;
  OptionStrictHelperLaneWaveOps helper_26;
  dxil_spv_option_denorm_preserve_support *denorm;
  OptionDenormPreserveSupport helper_25;
  dxil_spv_option_force_subgroup_size *subgroup;
  undefined4 local_280;
  OptionForceSubgroupSize helper_24;
  dxil_spv_option_physical_address_descriptor_indexing *indexing;
  undefined4 local_260;
  OptionPhysicalAddressDescriptorIndexing helper_23;
  dxil_spv_option_arithmetic_relaxed_precision *robust_1;
  OptionArithmeticRelaxedPrecision helper_22;
  dxil_spv_option_robust_physical_cbv_load *robust;
  OptionRobustPhysicalCBVLoad helper_21;
  dxil_spv_option_barycentric_khr *opt_2;
  OptionBarycentricKHR helper_20;
  dxil_spv_option_scalar_block_layout *opt_1;
  OptionScalarBlockLayout helper_19;
  OptionInvariantPosition local_1f0;
  OptionInvariantPosition helper_18;
  OptionShaderRayTracingPrimitiveCulling local_1e0;
  OptionShaderRayTracingPrimitiveCulling helper_17;
  OptionShaderI8Dot local_1d0;
  OptionShaderI8Dot helper_16;
  dxil_spv_option_min_precision_native_16bit *minprec;
  OptionMinPrecisionNative16Bit helper_15;
  dxil_spv_option_descriptor_qa *qa;
  OptionDescriptorQA helper_14;
  OptionStorageInputOutput16 local_170;
  OptionStorageInputOutput16 helper_13;
  dxil_spv_option_bindless_offset_buffer_layout *opt;
  OptionBindlessOffsetBufferLayout helper_12;
  OptionBindlessTypedBufferOffsets local_140;
  OptionBindlessTypedBufferOffsets helper_11;
  char *name;
  OptionShaderSourceFile helper_10;
  OptionTypedUAVReadWithoutFormat local_f8;
  OptionTypedUAVReadWithoutFormat helper_9;
  OptionSSBOAlignment local_e8;
  OptionSSBOAlignment helper_8;
  undefined1 local_d4 [8];
  OptionSBTDescriptorSizeLog2 helper_7;
  OptionPhysicalStorageBuffer local_c0;
  OptionPhysicalStorageBuffer helper_6;
  OptionBindlessCBVSSBOEmulation local_b0;
  OptionBindlessCBVSSBOEmulation helper_5;
  dxil_spv_option_root_constant_inline_uniform_block *ubo;
  OptionRootConstantInlineUniformBlock helper_4;
  dxil_spv_option_rasterizer_sample_count *count;
  undefined4 local_70;
  OptionRasterizerSampleCount helper_3;
  dxil_spv_option_output_swizzle *input;
  OptionOutputSwizzle helper_2;
  OptionDualSourceBlending local_38;
  OptionDualSourceBlending helper_1;
  OptionShaderDemoteToHelper local_28;
  OptionShaderDemoteToHelper helper;
  dxil_spv_option_base *option_local;
  dxil_spv_converter converter_local;
  
  helper = (OptionShaderDemoteToHelper)option;
  dVar1 = dxil_spv_converter_supports_option(option->type);
  if (dVar1 == '\0') {
    converter_local._4_4_ = DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    switch(*(undefined4 *)helper) {
    case 1:
      dxil_spv::OptionShaderDemoteToHelper::OptionShaderDemoteToHelper(&local_28);
      local_28.supported = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionShaderDemoteToHelper>((OptionShaderDemoteToHelper *)&helper_1);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionShaderDemoteToHelper,std::default_delete<dxil_spv::OptionShaderDemoteToHelper>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionShaderDemoteToHelper,_std::default_delete<dxil_spv::OptionShaderDemoteToHelper>_>
                  *)&helper_1);
      std::
      unique_ptr<dxil_spv::OptionShaderDemoteToHelper,_std::default_delete<dxil_spv::OptionShaderDemoteToHelper>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionShaderDemoteToHelper,_std::default_delete<dxil_spv::OptionShaderDemoteToHelper>_>
                     *)&helper_1);
      break;
    case 2:
      dxil_spv::OptionDualSourceBlending::OptionDualSourceBlending(&local_38);
      local_38.enabled = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionDualSourceBlending>
                ((OptionDualSourceBlending *)&helper_2.swizzle_count);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDualSourceBlending,std::default_delete<dxil_spv::OptionDualSourceBlending>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDualSourceBlending,_std::default_delete<dxil_spv::OptionDualSourceBlending>_>
                  *)&helper_2.swizzle_count);
      std::
      unique_ptr<dxil_spv::OptionDualSourceBlending,_std::default_delete<dxil_spv::OptionDualSourceBlending>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionDualSourceBlending,_std::default_delete<dxil_spv::OptionDualSourceBlending>_>
                     *)&helper_2.swizzle_count);
      break;
    case 3:
      dxil_spv::OptionOutputSwizzle::OptionOutputSwizzle((OptionOutputSwizzle *)&input);
      helper_2._0_8_ = *(undefined8 *)((long)helper + 8);
      helper_2.swizzles._0_4_ = *(undefined4 *)((long)helper + 0x10);
      duplicate<dxil_spv::OptionOutputSwizzle>((OptionOutputSwizzle *)&helper_3.count);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionOutputSwizzle,std::default_delete<dxil_spv::OptionOutputSwizzle>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionOutputSwizzle,_std::default_delete<dxil_spv::OptionOutputSwizzle>_>
                  *)&helper_3.count);
      std::
      unique_ptr<dxil_spv::OptionOutputSwizzle,_std::default_delete<dxil_spv::OptionOutputSwizzle>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionOutputSwizzle,_std::default_delete<dxil_spv::OptionOutputSwizzle>_>
                     *)&helper_3.count);
      break;
    case 4:
      dxil_spv::OptionRasterizerSampleCount::OptionRasterizerSampleCount
                ((OptionRasterizerSampleCount *)((long)&count + 4));
      local_70 = *(undefined4 *)((long)helper + 4);
      helper_3.super_OptionBase.type._0_1_ = *(char *)((long)helper + 8) != '\0';
      duplicate<dxil_spv::OptionRasterizerSampleCount>
                ((OptionRasterizerSampleCount *)&helper_4.binding);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionRasterizerSampleCount,std::default_delete<dxil_spv::OptionRasterizerSampleCount>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionRasterizerSampleCount,_std::default_delete<dxil_spv::OptionRasterizerSampleCount>_>
                  *)&helper_4.binding);
      std::
      unique_ptr<dxil_spv::OptionRasterizerSampleCount,_std::default_delete<dxil_spv::OptionRasterizerSampleCount>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionRasterizerSampleCount,_std::default_delete<dxil_spv::OptionRasterizerSampleCount>_>
                     *)&helper_4.binding);
      break;
    case 5:
      dxil_spv::OptionRootConstantInlineUniformBlock::OptionRootConstantInlineUniformBlock
                ((OptionRootConstantInlineUniformBlock *)&ubo);
      ubo._4_4_ = *(undefined4 *)((long)helper + 4);
      helper_4.super_OptionBase.type = *(Option *)((long)helper + 8);
      helper_4.desc_set._0_1_ = *(char *)((long)helper + 0xc) == '\x01';
      duplicate<dxil_spv::OptionRootConstantInlineUniformBlock>
                ((OptionRootConstantInlineUniformBlock *)&helper_5);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionRootConstantInlineUniformBlock,std::default_delete<dxil_spv::OptionRootConstantInlineUniformBlock>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionRootConstantInlineUniformBlock,_std::default_delete<dxil_spv::OptionRootConstantInlineUniformBlock>_>
                  *)&helper_5);
      std::
      unique_ptr<dxil_spv::OptionRootConstantInlineUniformBlock,_std::default_delete<dxil_spv::OptionRootConstantInlineUniformBlock>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionRootConstantInlineUniformBlock,_std::default_delete<dxil_spv::OptionRootConstantInlineUniformBlock>_>
                     *)&helper_5);
      break;
    case 6:
      dxil_spv::OptionBindlessCBVSSBOEmulation::OptionBindlessCBVSSBOEmulation(&local_b0);
      local_b0.enable = *(char *)((long)helper + 4) == '\x01';
      duplicate<dxil_spv::OptionBindlessCBVSSBOEmulation>
                ((OptionBindlessCBVSSBOEmulation *)&helper_6);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionBindlessCBVSSBOEmulation,std::default_delete<dxil_spv::OptionBindlessCBVSSBOEmulation>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionBindlessCBVSSBOEmulation,_std::default_delete<dxil_spv::OptionBindlessCBVSSBOEmulation>_>
                  *)&helper_6);
      std::
      unique_ptr<dxil_spv::OptionBindlessCBVSSBOEmulation,_std::default_delete<dxil_spv::OptionBindlessCBVSSBOEmulation>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionBindlessCBVSSBOEmulation,_std::default_delete<dxil_spv::OptionBindlessCBVSSBOEmulation>_>
                     *)&helper_6);
      break;
    case 7:
      dxil_spv::OptionPhysicalStorageBuffer::OptionPhysicalStorageBuffer(&local_c0);
      local_c0.enable = *(char *)((long)helper + 4) == '\x01';
      duplicate<dxil_spv::OptionPhysicalStorageBuffer>
                ((OptionPhysicalStorageBuffer *)&helper_7.size_log2_srv_uav_cbv);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionPhysicalStorageBuffer,std::default_delete<dxil_spv::OptionPhysicalStorageBuffer>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionPhysicalStorageBuffer,_std::default_delete<dxil_spv::OptionPhysicalStorageBuffer>_>
                  *)&helper_7.size_log2_srv_uav_cbv);
      std::
      unique_ptr<dxil_spv::OptionPhysicalStorageBuffer,_std::default_delete<dxil_spv::OptionPhysicalStorageBuffer>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionPhysicalStorageBuffer,_std::default_delete<dxil_spv::OptionPhysicalStorageBuffer>_>
                     *)&helper_7.size_log2_srv_uav_cbv);
      break;
    case 8:
      dxil_spv::OptionSBTDescriptorSizeLog2::OptionSBTDescriptorSizeLog2
                ((OptionSBTDescriptorSizeLog2 *)local_d4);
      local_d4._4_4_ = *(uint *)((long)helper + 4);
      helper_7.super_OptionBase.type = *(Option *)((long)helper + 8);
      duplicate<dxil_spv::OptionSBTDescriptorSizeLog2>((OptionSBTDescriptorSizeLog2 *)&helper_8);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionSBTDescriptorSizeLog2,std::default_delete<dxil_spv::OptionSBTDescriptorSizeLog2>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionSBTDescriptorSizeLog2,_std::default_delete<dxil_spv::OptionSBTDescriptorSizeLog2>_>
                  *)&helper_8);
      std::
      unique_ptr<dxil_spv::OptionSBTDescriptorSizeLog2,_std::default_delete<dxil_spv::OptionSBTDescriptorSizeLog2>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionSBTDescriptorSizeLog2,_std::default_delete<dxil_spv::OptionSBTDescriptorSizeLog2>_>
                     *)&helper_8);
      break;
    case 9:
      dxil_spv::OptionSSBOAlignment::OptionSSBOAlignment(&local_e8);
      local_e8.alignment = *(uint *)((long)helper + 4);
      duplicate<dxil_spv::OptionSSBOAlignment>((OptionSSBOAlignment *)&helper_9);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionSSBOAlignment,std::default_delete<dxil_spv::OptionSSBOAlignment>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionSSBOAlignment,_std::default_delete<dxil_spv::OptionSSBOAlignment>_>
                  *)&helper_9);
      std::
      unique_ptr<dxil_spv::OptionSSBOAlignment,_std::default_delete<dxil_spv::OptionSSBOAlignment>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionSSBOAlignment,_std::default_delete<dxil_spv::OptionSSBOAlignment>_>
                     *)&helper_9);
      break;
    case 10:
      dxil_spv::OptionTypedUAVReadWithoutFormat::OptionTypedUAVReadWithoutFormat(&local_f8);
      local_f8.supported = (*(byte *)((long)helper + 4) & 1) == 1;
      duplicate<dxil_spv::OptionTypedUAVReadWithoutFormat>
                ((OptionTypedUAVReadWithoutFormat *)((long)&helper_10.name.field_2 + 8));
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionTypedUAVReadWithoutFormat,std::default_delete<dxil_spv::OptionTypedUAVReadWithoutFormat>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionTypedUAVReadWithoutFormat,_std::default_delete<dxil_spv::OptionTypedUAVReadWithoutFormat>_>
                  *)((long)&helper_10.name.field_2 + 8));
      std::
      unique_ptr<dxil_spv::OptionTypedUAVReadWithoutFormat,_std::default_delete<dxil_spv::OptionTypedUAVReadWithoutFormat>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionTypedUAVReadWithoutFormat,_std::default_delete<dxil_spv::OptionTypedUAVReadWithoutFormat>_>
                     *)((long)&helper_10.name.field_2 + 8));
      break;
    case 0xb:
      dxil_spv::OptionShaderSourceFile::OptionShaderSourceFile((OptionShaderSourceFile *)&name);
      if (*(char **)((long)helper + 8) != (char *)0x0) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)&helper_10,*(char **)((long)helper + 8));
      }
      duplicate<dxil_spv::OptionShaderSourceFile>((OptionShaderSourceFile *)&helper_11);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionShaderSourceFile,std::default_delete<dxil_spv::OptionShaderSourceFile>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionShaderSourceFile,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
                  *)&helper_11);
      std::
      unique_ptr<dxil_spv::OptionShaderSourceFile,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionShaderSourceFile,_std::default_delete<dxil_spv::OptionShaderSourceFile>_>
                     *)&helper_11);
      dxil_spv::OptionShaderSourceFile::~OptionShaderSourceFile((OptionShaderSourceFile *)&name);
      break;
    case 0xc:
      dxil_spv::OptionBindlessTypedBufferOffsets::OptionBindlessTypedBufferOffsets(&local_140);
      local_140.enable = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionBindlessTypedBufferOffsets>
                ((OptionBindlessTypedBufferOffsets *)&helper_12.typed_offset);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionBindlessTypedBufferOffsets,std::default_delete<dxil_spv::OptionBindlessTypedBufferOffsets>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionBindlessTypedBufferOffsets,_std::default_delete<dxil_spv::OptionBindlessTypedBufferOffsets>_>
                  *)&helper_12.typed_offset);
      std::
      unique_ptr<dxil_spv::OptionBindlessTypedBufferOffsets,_std::default_delete<dxil_spv::OptionBindlessTypedBufferOffsets>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionBindlessTypedBufferOffsets,_std::default_delete<dxil_spv::OptionBindlessTypedBufferOffsets>_>
                     *)&helper_12.typed_offset);
      break;
    case 0xd:
      dxil_spv::OptionBindlessOffsetBufferLayout::OptionBindlessOffsetBufferLayout
                ((OptionBindlessOffsetBufferLayout *)&opt);
      opt._4_4_ = *(undefined4 *)((long)helper + 4);
      helper_12.super_OptionBase.type = *(Option *)((long)helper + 8);
      helper_12.untyped_offset = *(uint *)((long)helper + 0xc);
      duplicate<dxil_spv::OptionBindlessOffsetBufferLayout>
                ((OptionBindlessOffsetBufferLayout *)&helper_13);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionBindlessOffsetBufferLayout,std::default_delete<dxil_spv::OptionBindlessOffsetBufferLayout>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionBindlessOffsetBufferLayout,_std::default_delete<dxil_spv::OptionBindlessOffsetBufferLayout>_>
                  *)&helper_13);
      std::
      unique_ptr<dxil_spv::OptionBindlessOffsetBufferLayout,_std::default_delete<dxil_spv::OptionBindlessOffsetBufferLayout>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionBindlessOffsetBufferLayout,_std::default_delete<dxil_spv::OptionBindlessOffsetBufferLayout>_>
                     *)&helper_13);
      break;
    case 0xe:
      dxil_spv::OptionStorageInputOutput16::OptionStorageInputOutput16(&local_170);
      local_170.supported = *(char *)((long)helper + 4) == '\x01';
      duplicate<dxil_spv::OptionStorageInputOutput16>
                ((OptionStorageInputOutput16 *)&helper_14.shader_hash);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionStorageInputOutput16,std::default_delete<dxil_spv::OptionStorageInputOutput16>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionStorageInputOutput16,_std::default_delete<dxil_spv::OptionStorageInputOutput16>_>
                  *)&helper_14.shader_hash);
      std::
      unique_ptr<dxil_spv::OptionStorageInputOutput16,_std::default_delete<dxil_spv::OptionStorageInputOutput16>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionStorageInputOutput16,_std::default_delete<dxil_spv::OptionStorageInputOutput16>_>
                     *)&helper_14.shader_hash);
      break;
    case 0xf:
      dxil_spv::OptionDescriptorQA::OptionDescriptorQA((OptionDescriptorQA *)&qa);
      qa._4_1_ = *(char *)((long)helper + 4) == '\x01';
      helper_14._24_8_ = *(undefined8 *)((long)helper + 0x20);
      helper_14._4_4_ = *(undefined4 *)((long)helper + 0xc);
      helper_14.version = *(uint32_t *)((long)helper + 0x10);
      helper_14.global_desc_set = *(uint32_t *)((long)helper + 0x14);
      helper_14.global_binding = *(uint32_t *)((long)helper + 0x18);
      helper_14.super_OptionBase.type = *(Option *)((long)helper + 8);
      duplicate<dxil_spv::OptionDescriptorQA>((OptionDescriptorQA *)&helper_15);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDescriptorQA,std::default_delete<dxil_spv::OptionDescriptorQA>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDescriptorQA,_std::default_delete<dxil_spv::OptionDescriptorQA>_>
                  *)&helper_15);
      std::
      unique_ptr<dxil_spv::OptionDescriptorQA,_std::default_delete<dxil_spv::OptionDescriptorQA>_>::
      ~unique_ptr((unique_ptr<dxil_spv::OptionDescriptorQA,_std::default_delete<dxil_spv::OptionDescriptorQA>_>
                   *)&helper_15);
      break;
    case 0x10:
      dxil_spv::OptionMinPrecisionNative16Bit::OptionMinPrecisionNative16Bit
                ((OptionMinPrecisionNative16Bit *)&minprec);
      minprec._4_1_ = *(char *)((long)helper + 4) == '\x01';
      duplicate<dxil_spv::OptionMinPrecisionNative16Bit>
                ((OptionMinPrecisionNative16Bit *)&helper_16);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionMinPrecisionNative16Bit,std::default_delete<dxil_spv::OptionMinPrecisionNative16Bit>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionMinPrecisionNative16Bit,_std::default_delete<dxil_spv::OptionMinPrecisionNative16Bit>_>
                  *)&helper_16);
      std::
      unique_ptr<dxil_spv::OptionMinPrecisionNative16Bit,_std::default_delete<dxil_spv::OptionMinPrecisionNative16Bit>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionMinPrecisionNative16Bit,_std::default_delete<dxil_spv::OptionMinPrecisionNative16Bit>_>
                     *)&helper_16);
      break;
    case 0x11:
      dxil_spv::OptionShaderI8Dot::OptionShaderI8Dot(&local_1d0);
      local_1d0.supported = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionShaderI8Dot>((OptionShaderI8Dot *)&helper_17);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionShaderI8Dot,std::default_delete<dxil_spv::OptionShaderI8Dot>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionShaderI8Dot,_std::default_delete<dxil_spv::OptionShaderI8Dot>_>
                  *)&helper_17);
      std::
      unique_ptr<dxil_spv::OptionShaderI8Dot,_std::default_delete<dxil_spv::OptionShaderI8Dot>_>::
      ~unique_ptr((unique_ptr<dxil_spv::OptionShaderI8Dot,_std::default_delete<dxil_spv::OptionShaderI8Dot>_>
                   *)&helper_17);
      break;
    case 0x12:
      dxil_spv::OptionShaderRayTracingPrimitiveCulling::OptionShaderRayTracingPrimitiveCulling
                (&local_1e0);
      local_1e0.supported = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionShaderRayTracingPrimitiveCulling>
                ((OptionShaderRayTracingPrimitiveCulling *)&helper_18);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionShaderRayTracingPrimitiveCulling,std::default_delete<dxil_spv::OptionShaderRayTracingPrimitiveCulling>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionShaderRayTracingPrimitiveCulling,_std::default_delete<dxil_spv::OptionShaderRayTracingPrimitiveCulling>_>
                  *)&helper_18);
      std::
      unique_ptr<dxil_spv::OptionShaderRayTracingPrimitiveCulling,_std::default_delete<dxil_spv::OptionShaderRayTracingPrimitiveCulling>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionShaderRayTracingPrimitiveCulling,_std::default_delete<dxil_spv::OptionShaderRayTracingPrimitiveCulling>_>
                     *)&helper_18);
      break;
    case 0x13:
      dxil_spv::OptionInvariantPosition::OptionInvariantPosition(&local_1f0);
      local_1f0.enabled = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionInvariantPosition>((OptionInvariantPosition *)&helper_19);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionInvariantPosition,std::default_delete<dxil_spv::OptionInvariantPosition>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionInvariantPosition,_std::default_delete<dxil_spv::OptionInvariantPosition>_>
                  *)&helper_19);
      std::
      unique_ptr<dxil_spv::OptionInvariantPosition,_std::default_delete<dxil_spv::OptionInvariantPosition>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionInvariantPosition,_std::default_delete<dxil_spv::OptionInvariantPosition>_>
                     *)&helper_19);
      break;
    case 0x14:
      dxil_spv::OptionScalarBlockLayout::OptionScalarBlockLayout((OptionScalarBlockLayout *)&opt_1);
      opt_1._4_1_ = *(char *)((long)helper + 4) != '\0';
      opt_1._5_1_ = *(char *)((long)helper + 5) != '\0';
      duplicate<dxil_spv::OptionScalarBlockLayout>((OptionScalarBlockLayout *)&helper_20);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionScalarBlockLayout,std::default_delete<dxil_spv::OptionScalarBlockLayout>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionScalarBlockLayout,_std::default_delete<dxil_spv::OptionScalarBlockLayout>_>
                  *)&helper_20);
      std::
      unique_ptr<dxil_spv::OptionScalarBlockLayout,_std::default_delete<dxil_spv::OptionScalarBlockLayout>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionScalarBlockLayout,_std::default_delete<dxil_spv::OptionScalarBlockLayout>_>
                     *)&helper_20);
      break;
    case 0x15:
      dxil_spv::OptionBarycentricKHR::OptionBarycentricKHR((OptionBarycentricKHR *)&opt_2);
      opt_2._4_1_ = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionBarycentricKHR>((OptionBarycentricKHR *)&helper_21);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionBarycentricKHR,std::default_delete<dxil_spv::OptionBarycentricKHR>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionBarycentricKHR,_std::default_delete<dxil_spv::OptionBarycentricKHR>_>
                  *)&helper_21);
      std::
      unique_ptr<dxil_spv::OptionBarycentricKHR,_std::default_delete<dxil_spv::OptionBarycentricKHR>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionBarycentricKHR,_std::default_delete<dxil_spv::OptionBarycentricKHR>_>
                     *)&helper_21);
      break;
    case 0x16:
      dxil_spv::OptionRobustPhysicalCBVLoad::OptionRobustPhysicalCBVLoad
                ((OptionRobustPhysicalCBVLoad *)&robust);
      robust._4_1_ = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionRobustPhysicalCBVLoad>((OptionRobustPhysicalCBVLoad *)&helper_22);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionRobustPhysicalCBVLoad,std::default_delete<dxil_spv::OptionRobustPhysicalCBVLoad>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionRobustPhysicalCBVLoad,_std::default_delete<dxil_spv::OptionRobustPhysicalCBVLoad>_>
                  *)&helper_22);
      std::
      unique_ptr<dxil_spv::OptionRobustPhysicalCBVLoad,_std::default_delete<dxil_spv::OptionRobustPhysicalCBVLoad>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionRobustPhysicalCBVLoad,_std::default_delete<dxil_spv::OptionRobustPhysicalCBVLoad>_>
                     *)&helper_22);
      break;
    case 0x17:
      dxil_spv::OptionArithmeticRelaxedPrecision::OptionArithmeticRelaxedPrecision
                ((OptionArithmeticRelaxedPrecision *)&robust_1);
      robust_1._4_1_ = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionArithmeticRelaxedPrecision>
                ((OptionArithmeticRelaxedPrecision *)&helper_23.element_stride);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionArithmeticRelaxedPrecision,std::default_delete<dxil_spv::OptionArithmeticRelaxedPrecision>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionArithmeticRelaxedPrecision,_std::default_delete<dxil_spv::OptionArithmeticRelaxedPrecision>_>
                  *)&helper_23.element_stride);
      std::
      unique_ptr<dxil_spv::OptionArithmeticRelaxedPrecision,_std::default_delete<dxil_spv::OptionArithmeticRelaxedPrecision>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionArithmeticRelaxedPrecision,_std::default_delete<dxil_spv::OptionArithmeticRelaxedPrecision>_>
                     *)&helper_23.element_stride);
      break;
    case 0x18:
      dxil_spv::OptionPhysicalAddressDescriptorIndexing::OptionPhysicalAddressDescriptorIndexing
                ((OptionPhysicalAddressDescriptorIndexing *)((long)&indexing + 4));
      local_260 = *(undefined4 *)((long)helper + 4);
      helper_23.super_OptionBase.type = *(Option *)((long)helper + 8);
      duplicate<dxil_spv::OptionPhysicalAddressDescriptorIndexing>
                ((OptionPhysicalAddressDescriptorIndexing *)&helper_24.forced_value);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionPhysicalAddressDescriptorIndexing,std::default_delete<dxil_spv::OptionPhysicalAddressDescriptorIndexing>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionPhysicalAddressDescriptorIndexing,_std::default_delete<dxil_spv::OptionPhysicalAddressDescriptorIndexing>_>
                  *)&helper_24.forced_value);
      std::
      unique_ptr<dxil_spv::OptionPhysicalAddressDescriptorIndexing,_std::default_delete<dxil_spv::OptionPhysicalAddressDescriptorIndexing>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionPhysicalAddressDescriptorIndexing,_std::default_delete<dxil_spv::OptionPhysicalAddressDescriptorIndexing>_>
                     *)&helper_24.forced_value);
      break;
    case 0x19:
      dxil_spv::OptionForceSubgroupSize::OptionForceSubgroupSize
                ((OptionForceSubgroupSize *)((long)&subgroup + 4));
      local_280 = *(undefined4 *)((long)helper + 4);
      helper_24.super_OptionBase.type._0_1_ = *(char *)((long)helper + 8) != '\0';
      duplicate<dxil_spv::OptionForceSubgroupSize>((OptionForceSubgroupSize *)&helper_25);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionForceSubgroupSize,std::default_delete<dxil_spv::OptionForceSubgroupSize>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionForceSubgroupSize,_std::default_delete<dxil_spv::OptionForceSubgroupSize>_>
                  *)&helper_25);
      std::
      unique_ptr<dxil_spv::OptionForceSubgroupSize,_std::default_delete<dxil_spv::OptionForceSubgroupSize>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionForceSubgroupSize,_std::default_delete<dxil_spv::OptionForceSubgroupSize>_>
                     *)&helper_25);
      break;
    case 0x1a:
      dxil_spv::OptionDenormPreserveSupport::OptionDenormPreserveSupport
                ((OptionDenormPreserveSupport *)&denorm);
      denorm._4_1_ = *(char *)((long)helper + 4) != '\0';
      denorm._5_1_ = *(char *)((long)helper + 5) != '\0';
      duplicate<dxil_spv::OptionDenormPreserveSupport>((OptionDenormPreserveSupport *)&helper_26);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDenormPreserveSupport,std::default_delete<dxil_spv::OptionDenormPreserveSupport>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDenormPreserveSupport,_std::default_delete<dxil_spv::OptionDenormPreserveSupport>_>
                  *)&helper_26);
      std::
      unique_ptr<dxil_spv::OptionDenormPreserveSupport,_std::default_delete<dxil_spv::OptionDenormPreserveSupport>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionDenormPreserveSupport,_std::default_delete<dxil_spv::OptionDenormPreserveSupport>_>
                     *)&helper_26);
      break;
    case 0x1b:
      dxil_spv::OptionStrictHelperLaneWaveOps::OptionStrictHelperLaneWaveOps
                ((OptionStrictHelperLaneWaveOps *)&strict);
      strict._4_1_ = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionStrictHelperLaneWaveOps>
                ((OptionStrictHelperLaneWaveOps *)&helper_27);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionStrictHelperLaneWaveOps,std::default_delete<dxil_spv::OptionStrictHelperLaneWaveOps>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionStrictHelperLaneWaveOps,_std::default_delete<dxil_spv::OptionStrictHelperLaneWaveOps>_>
                  *)&helper_27);
      std::
      unique_ptr<dxil_spv::OptionStrictHelperLaneWaveOps,_std::default_delete<dxil_spv::OptionStrictHelperLaneWaveOps>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionStrictHelperLaneWaveOps,_std::default_delete<dxil_spv::OptionStrictHelperLaneWaveOps>_>
                     *)&helper_27);
      break;
    case 0x1c:
      dxil_spv::OptionSubgroupPartitionedNV::OptionSubgroupPartitionedNV
                ((OptionSubgroupPartitionedNV *)&partitioned);
      partitioned._4_1_ = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionSubgroupPartitionedNV>((OptionSubgroupPartitionedNV *)&helper_28);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionSubgroupPartitionedNV,std::default_delete<dxil_spv::OptionSubgroupPartitionedNV>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionSubgroupPartitionedNV,_std::default_delete<dxil_spv::OptionSubgroupPartitionedNV>_>
                  *)&helper_28);
      std::
      unique_ptr<dxil_spv::OptionSubgroupPartitionedNV,_std::default_delete<dxil_spv::OptionSubgroupPartitionedNV>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionSubgroupPartitionedNV,_std::default_delete<dxil_spv::OptionSubgroupPartitionedNV>_>
                     *)&helper_28);
      break;
    case 0x1d:
      dxil_spv::OptionDeadCodeEliminate::OptionDeadCodeEliminate
                ((OptionDeadCodeEliminate *)&eliminate);
      eliminate._4_1_ = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionDeadCodeEliminate>((OptionDeadCodeEliminate *)&helper_29);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDeadCodeEliminate,std::default_delete<dxil_spv::OptionDeadCodeEliminate>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDeadCodeEliminate,_std::default_delete<dxil_spv::OptionDeadCodeEliminate>_>
                  *)&helper_29);
      std::
      unique_ptr<dxil_spv::OptionDeadCodeEliminate,_std::default_delete<dxil_spv::OptionDeadCodeEliminate>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionDeadCodeEliminate,_std::default_delete<dxil_spv::OptionDeadCodeEliminate>_>
                     *)&helper_29);
      break;
    case 0x1e:
      dxil_spv::OptionPreciseControl::OptionPreciseControl((OptionPreciseControl *)&precise);
      precise._4_1_ = *(char *)((long)helper + 4) != '\0';
      precise._5_1_ = *(char *)((long)helper + 5) != '\0';
      duplicate<dxil_spv::OptionPreciseControl>((OptionPreciseControl *)&helper_30);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionPreciseControl,std::default_delete<dxil_spv::OptionPreciseControl>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionPreciseControl,_std::default_delete<dxil_spv::OptionPreciseControl>_>
                  *)&helper_30);
      std::
      unique_ptr<dxil_spv::OptionPreciseControl,_std::default_delete<dxil_spv::OptionPreciseControl>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionPreciseControl,_std::default_delete<dxil_spv::OptionPreciseControl>_>
                     *)&helper_30);
      break;
    case 0x1f:
      dxil_spv::OptionSampleGradOptimizationControl::OptionSampleGradOptimizationControl
                ((OptionSampleGradOptimizationControl *)&precise_1);
      precise_1._4_1_ = *(char *)((long)helper + 4) != '\0';
      precise_1._5_1_ = *(char *)((long)helper + 5) != '\0';
      duplicate<dxil_spv::OptionSampleGradOptimizationControl>
                ((OptionSampleGradOptimizationControl *)&helper_31);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionSampleGradOptimizationControl,std::default_delete<dxil_spv::OptionSampleGradOptimizationControl>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionSampleGradOptimizationControl,_std::default_delete<dxil_spv::OptionSampleGradOptimizationControl>_>
                  *)&helper_31);
      std::
      unique_ptr<dxil_spv::OptionSampleGradOptimizationControl,_std::default_delete<dxil_spv::OptionSampleGradOptimizationControl>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionSampleGradOptimizationControl,_std::default_delete<dxil_spv::OptionSampleGradOptimizationControl>_>
                     *)&helper_31);
      break;
    case 0x20:
      dxil_spv::OptionOpacityMicromap::OptionOpacityMicromap((OptionOpacityMicromap *)&omm);
      omm._4_1_ = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionOpacityMicromap>
                ((OptionOpacityMicromap *)&helper_32.use_shader_metadata);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionOpacityMicromap,std::default_delete<dxil_spv::OptionOpacityMicromap>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionOpacityMicromap,_std::default_delete<dxil_spv::OptionOpacityMicromap>_>
                  *)&helper_32.use_shader_metadata);
      std::
      unique_ptr<dxil_spv::OptionOpacityMicromap,_std::default_delete<dxil_spv::OptionOpacityMicromap>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionOpacityMicromap,_std::default_delete<dxil_spv::OptionOpacityMicromap>_>
                     *)&helper_32.use_shader_metadata);
      break;
    case 0x21:
      dxil_spv::OptionBranchControl::OptionBranchControl((OptionBranchControl *)((long)&branch + 4))
      ;
      local_348 = *(char *)((long)helper + 4) != '\0';
      helper_32.super_OptionBase.type._0_1_ = *(char *)((long)helper + 8) != '\0';
      local_346 = *(char *)((long)helper + 6) != '\0';
      local_347 = *(char *)((long)helper + 5) != '\0';
      local_345 = *(char *)((long)helper + 7) != '\0';
      duplicate<dxil_spv::OptionBranchControl>((OptionBranchControl *)&helper_33.minimum_size);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionBranchControl,std::default_delete<dxil_spv::OptionBranchControl>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionBranchControl,_std::default_delete<dxil_spv::OptionBranchControl>_>
                  *)&helper_33.minimum_size);
      std::
      unique_ptr<dxil_spv::OptionBranchControl,_std::default_delete<dxil_spv::OptionBranchControl>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionBranchControl,_std::default_delete<dxil_spv::OptionBranchControl>_>
                     *)&helper_33.minimum_size);
      break;
    case 0x22:
      dxil_spv::OptionSubgroupProperties::OptionSubgroupProperties
                ((OptionSubgroupProperties *)((long)&sub + 4));
      local_368 = *(undefined4 *)((long)helper + 4);
      helper_33.super_OptionBase.type = *(Option *)((long)helper + 8);
      duplicate<dxil_spv::OptionSubgroupProperties>((OptionSubgroupProperties *)&helper_34);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionSubgroupProperties,std::default_delete<dxil_spv::OptionSubgroupProperties>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionSubgroupProperties,_std::default_delete<dxil_spv::OptionSubgroupProperties>_>
                  *)&helper_34);
      std::
      unique_ptr<dxil_spv::OptionSubgroupProperties,_std::default_delete<dxil_spv::OptionSubgroupProperties>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionSubgroupProperties,_std::default_delete<dxil_spv::OptionSubgroupProperties>_>
                     *)&helper_34);
      break;
    case 0x23:
      dxil_spv::OptionDescriptorHeapRobustness::OptionDescriptorHeapRobustness
                ((OptionDescriptorHeapRobustness *)&rob);
      rob._4_1_ = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionDescriptorHeapRobustness>
                ((OptionDescriptorHeapRobustness *)&helper_35);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDescriptorHeapRobustness,std::default_delete<dxil_spv::OptionDescriptorHeapRobustness>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDescriptorHeapRobustness,_std::default_delete<dxil_spv::OptionDescriptorHeapRobustness>_>
                  *)&helper_35);
      std::
      unique_ptr<dxil_spv::OptionDescriptorHeapRobustness,_std::default_delete<dxil_spv::OptionDescriptorHeapRobustness>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionDescriptorHeapRobustness,_std::default_delete<dxil_spv::OptionDescriptorHeapRobustness>_>
                     *)&helper_35);
      break;
    case 0x24:
      dxil_spv::OptionComputeShaderDerivativesNV::OptionComputeShaderDerivativesNV
                ((OptionComputeShaderDerivativesNV *)&deriv);
      deriv._4_1_ = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionComputeShaderDerivativesNV>
                ((OptionComputeShaderDerivativesNV *)&helper_36);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionComputeShaderDerivativesNV,std::default_delete<dxil_spv::OptionComputeShaderDerivativesNV>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionComputeShaderDerivativesNV,_std::default_delete<dxil_spv::OptionComputeShaderDerivativesNV>_>
                  *)&helper_36);
      std::
      unique_ptr<dxil_spv::OptionComputeShaderDerivativesNV,_std::default_delete<dxil_spv::OptionComputeShaderDerivativesNV>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionComputeShaderDerivativesNV,_std::default_delete<dxil_spv::OptionComputeShaderDerivativesNV>_>
                     *)&helper_36);
      break;
    case 0x25:
      dxil_spv::OptionQuadControlReconvergence::OptionQuadControlReconvergence
                ((OptionQuadControlReconvergence *)&quad);
      quad._4_1_ = *(char *)((long)helper + 4) != '\0';
      quad._5_1_ = *(char *)((long)helper + 5) != '\0';
      quad._6_1_ = *(char *)((long)helper + 6) != '\0';
      duplicate<dxil_spv::OptionQuadControlReconvergence>
                ((OptionQuadControlReconvergence *)&helper_37);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionQuadControlReconvergence,std::default_delete<dxil_spv::OptionQuadControlReconvergence>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionQuadControlReconvergence,_std::default_delete<dxil_spv::OptionQuadControlReconvergence>_>
                  *)&helper_37);
      std::
      unique_ptr<dxil_spv::OptionQuadControlReconvergence,_std::default_delete<dxil_spv::OptionQuadControlReconvergence>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionQuadControlReconvergence,_std::default_delete<dxil_spv::OptionQuadControlReconvergence>_>
                     *)&helper_37);
      break;
    case 0x26:
      dxil_spv::OptionRawAccessChainsNV::OptionRawAccessChainsNV((OptionRawAccessChainsNV *)&chain);
      chain._4_1_ = *(char *)((long)helper + 4) != '\0';
      duplicate<dxil_spv::OptionRawAccessChainsNV>((OptionRawAccessChainsNV *)&helper_38.driver_id);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionRawAccessChainsNV,std::default_delete<dxil_spv::OptionRawAccessChainsNV>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionRawAccessChainsNV,_std::default_delete<dxil_spv::OptionRawAccessChainsNV>_>
                  *)&helper_38.driver_id);
      std::
      unique_ptr<dxil_spv::OptionRawAccessChainsNV,_std::default_delete<dxil_spv::OptionRawAccessChainsNV>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionRawAccessChainsNV,_std::default_delete<dxil_spv::OptionRawAccessChainsNV>_>
                     *)&helper_38.driver_id);
      break;
    case 0x27:
      dxil_spv::OptionDriverVersion::OptionDriverVersion((OptionDriverVersion *)((long)&ver + 4));
      local_3e8 = *(undefined4 *)((long)helper + 4);
      helper_38.super_OptionBase.type = *(Option *)((long)helper + 8);
      duplicate<dxil_spv::OptionDriverVersion>((OptionDriverVersion *)&helper_39);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionDriverVersion,std::default_delete<dxil_spv::OptionDriverVersion>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionDriverVersion,_std::default_delete<dxil_spv::OptionDriverVersion>_>
                  *)&helper_39);
      std::
      unique_ptr<dxil_spv::OptionDriverVersion,_std::default_delete<dxil_spv::OptionDriverVersion>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionDriverVersion,_std::default_delete<dxil_spv::OptionDriverVersion>_>
                     *)&helper_39);
      break;
    case 0x28:
      dxil_spv::OptionComputeShaderDerivatives::OptionComputeShaderDerivatives
                ((OptionComputeShaderDerivatives *)&deriv_1);
      deriv_1._4_1_ = *(char *)((long)helper + 4) != '\0';
      deriv_1._5_1_ = *(char *)((long)helper + 5) != '\0';
      duplicate<dxil_spv::OptionComputeShaderDerivatives>
                ((OptionComputeShaderDerivatives *)&helper_40.type);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionComputeShaderDerivatives,std::default_delete<dxil_spv::OptionComputeShaderDerivatives>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionComputeShaderDerivatives,_std::default_delete<dxil_spv::OptionComputeShaderDerivatives>_>
                  *)&helper_40.type);
      std::
      unique_ptr<dxil_spv::OptionComputeShaderDerivatives,_std::default_delete<dxil_spv::OptionComputeShaderDerivatives>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionComputeShaderDerivatives,_std::default_delete<dxil_spv::OptionComputeShaderDerivatives>_>
                     *)&helper_40.type);
      break;
    case 0x29:
      dxil_spv::OptionInstructionInstrumentation::OptionInstructionInstrumentation
                ((OptionInstructionInstrumentation *)&inst);
      inst._4_1_ = *(char *)((long)helper + 4) != '\0';
      helper_40.super_OptionBase.type = *(Option *)((long)helper + 8);
      helper_40._4_4_ = *(undefined4 *)((long)helper + 0xc);
      helper_40.version = *(uint32_t *)((long)helper + 0x10);
      helper_40.control_desc_set = *(uint32_t *)((long)helper + 0x14);
      helper_40.control_binding = *(uint32_t *)((long)helper + 0x18);
      helper_40._24_8_ = *(undefined8 *)((long)helper + 0x20);
      helper_40.shader_hash._0_4_ = *(undefined4 *)((long)helper + 0x28);
      duplicate<dxil_spv::OptionInstructionInstrumentation>
                ((OptionInstructionInstrumentation *)&helper_41);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionInstructionInstrumentation,std::default_delete<dxil_spv::OptionInstructionInstrumentation>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionInstructionInstrumentation,_std::default_delete<dxil_spv::OptionInstructionInstrumentation>_>
                  *)&helper_41);
      std::
      unique_ptr<dxil_spv::OptionInstructionInstrumentation,_std::default_delete<dxil_spv::OptionInstructionInstrumentation>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionInstructionInstrumentation,_std::default_delete<dxil_spv::OptionInstructionInstrumentation>_>
                     *)&helper_41);
      break;
    case 0x2a:
      dxil_spv::OptionShaderQuirk::OptionShaderQuirk((OptionShaderQuirk *)&quirk);
      quirk._4_4_ = *(undefined4 *)((long)helper + 4);
      duplicate<dxil_spv::OptionShaderQuirk>((OptionShaderQuirk *)&helper_42);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionShaderQuirk,std::default_delete<dxil_spv::OptionShaderQuirk>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionShaderQuirk,_std::default_delete<dxil_spv::OptionShaderQuirk>_>
                  *)&helper_42);
      std::
      unique_ptr<dxil_spv::OptionShaderQuirk,_std::default_delete<dxil_spv::OptionShaderQuirk>_>::
      ~unique_ptr((unique_ptr<dxil_spv::OptionShaderQuirk,_std::default_delete<dxil_spv::OptionShaderQuirk>_>
                   *)&helper_42);
      break;
    case 0x2b:
      dxil_spv::OptionExtendedRobustness::OptionExtendedRobustness
                ((OptionExtendedRobustness *)&robust_2);
      robust_2._4_1_ = *(char *)((long)helper + 4) != '\0';
      robust_2._5_1_ = *(char *)((long)helper + 5) != '\0';
      robust_2._6_1_ = *(char *)((long)helper + 6) != '\0';
      duplicate<dxil_spv::OptionExtendedRobustness>((OptionExtendedRobustness *)&helper_43);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionExtendedRobustness,std::default_delete<dxil_spv::OptionExtendedRobustness>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionExtendedRobustness,_std::default_delete<dxil_spv::OptionExtendedRobustness>_>
                  *)&helper_43);
      std::
      unique_ptr<dxil_spv::OptionExtendedRobustness,_std::default_delete<dxil_spv::OptionExtendedRobustness>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionExtendedRobustness,_std::default_delete<dxil_spv::OptionExtendedRobustness>_>
                     *)&helper_43);
      break;
    case 0x2c:
      dxil_spv::OptionMaxTessFactor::OptionMaxTessFactor((OptionMaxTessFactor *)&tess_factor);
      local_498 = helper;
      tess_factor._4_4_ = *(undefined4 *)((long)helper + 4);
      duplicate<dxil_spv::OptionMaxTessFactor>(&local_4a0);
      std::
      vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
      ::
      emplace_back<std::unique_ptr<dxil_spv::OptionMaxTessFactor,std::default_delete<dxil_spv::OptionMaxTessFactor>>>
                ((vector<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,std::default_delete<dxil_spv::OptionBase>>>>
                  *)&converter->options,
                 (unique_ptr<dxil_spv::OptionMaxTessFactor,_std::default_delete<dxil_spv::OptionMaxTessFactor>_>
                  *)&local_4a0);
      std::
      unique_ptr<dxil_spv::OptionMaxTessFactor,_std::default_delete<dxil_spv::OptionMaxTessFactor>_>
      ::~unique_ptr((unique_ptr<dxil_spv::OptionMaxTessFactor,_std::default_delete<dxil_spv::OptionMaxTessFactor>_>
                     *)&local_4a0);
      break;
    default:
      return DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;
    }
    converter_local._4_4_ = DXIL_SPV_SUCCESS;
  }
  return converter_local._4_4_;
}

Assistant:

dxil_spv_result dxil_spv_converter_add_option(dxil_spv_converter converter, const dxil_spv_option_base *option)
{
	if (!dxil_spv_converter_supports_option(option->type))
		return DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;

	switch (option->type)
	{
	case DXIL_SPV_OPTION_SHADER_DEMOTE_TO_HELPER:
	{
		OptionShaderDemoteToHelper helper;
		helper.supported = bool(reinterpret_cast<const dxil_spv_option_shader_demote_to_helper *>(option)->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DUAL_SOURCE_BLENDING:
	{
		OptionDualSourceBlending helper;
		helper.enabled = bool(reinterpret_cast<const dxil_spv_option_dual_source_blending *>(option)->enabled);
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_OUTPUT_SWIZZLE:
	{
		OptionOutputSwizzle helper;
		const auto *input = reinterpret_cast<const dxil_spv_option_output_swizzle *>(option);
		helper.swizzles = input->swizzles;
		helper.swizzle_count = input->swizzle_count;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_RASTERIZER_SAMPLE_COUNT:
	{
		OptionRasterizerSampleCount helper;
		const auto *count = reinterpret_cast<const dxil_spv_option_rasterizer_sample_count *>(option);
		helper.count = count->sample_count;
		helper.spec_constant = bool(count->spec_constant);
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_ROOT_CONSTANT_INLINE_UNIFORM_BLOCK:
	{
		OptionRootConstantInlineUniformBlock helper;
		const auto *ubo = reinterpret_cast<const dxil_spv_option_root_constant_inline_uniform_block *>(option);
		helper.desc_set = ubo->desc_set;
		helper.binding = ubo->binding;
		helper.enable = ubo->enable == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BINDLESS_CBV_SSBO_EMULATION:
	{
		OptionBindlessCBVSSBOEmulation helper;
		helper.enable =
		    reinterpret_cast<const dxil_spv_option_bindless_cbv_ssbo_emulation *>(option)->enable == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_PHYSICAL_STORAGE_BUFFER:
	{
		OptionPhysicalStorageBuffer helper;
		helper.enable =
		    reinterpret_cast<const dxil_spv_option_physical_storage_buffer *>(option)->enable == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SBT_DESCRIPTOR_SIZE_LOG2:
	{
		OptionSBTDescriptorSizeLog2 helper;
		helper.size_log2_srv_uav_cbv = reinterpret_cast<const dxil_spv_option_sbt_descriptor_size_log2 *>(option)->size_log2_srv_uav_cbv;
		helper.size_log2_sampler = reinterpret_cast<const dxil_spv_option_sbt_descriptor_size_log2 *>(option)->size_log2_sampler;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SSBO_ALIGNMENT:
	{
		OptionSSBOAlignment helper;
		helper.alignment = reinterpret_cast<const dxil_spv_option_ssbo_alignment *>(option)->alignment;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_TYPED_UAV_READ_WITHOUT_FORMAT:
	{
		OptionTypedUAVReadWithoutFormat helper;
		helper.supported = reinterpret_cast<const dxil_spv_option_typed_uav_read_without_format *>(option)->supported == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_SOURCE_FILE:
	{
		OptionShaderSourceFile helper;
		const char *name = reinterpret_cast<const dxil_spv_option_shader_source_file *>(option)->name;
		if (name)
			helper.name = name;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BINDLESS_TYPED_BUFFER_OFFSETS:
	{
		OptionBindlessTypedBufferOffsets helper;
		helper.enable = reinterpret_cast<const dxil_spv_option_bindless_typed_buffer_offsets *>(option)->enable;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BINDLESS_OFFSET_BUFFER_LAYOUT:
	{
		OptionBindlessOffsetBufferLayout helper;
		auto *opt = reinterpret_cast<const dxil_spv_option_bindless_offset_buffer_layout *>(option);
		helper.untyped_offset = opt->untyped_offset;
		helper.typed_offset = opt->typed_offset;
		helper.stride = opt->stride;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_STORAGE_INPUT_OUTPUT_16BIT:
	{
		OptionStorageInputOutput16 helper;
		helper.supported =
		    reinterpret_cast<const dxil_spv_option_storage_input_output_16bit *>(option)->supported == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DESCRIPTOR_QA:
	{
		OptionDescriptorQA helper;
		auto *qa = reinterpret_cast<const dxil_spv_option_descriptor_qa *>(option);
		helper.enabled = qa->enabled == DXIL_SPV_TRUE;
		helper.shader_hash = qa->shader_hash;
		helper.global_desc_set = qa->global_desc_set;
		helper.global_binding = qa->global_binding;
		helper.heap_desc_set = qa->heap_desc_set;
		helper.heap_binding = qa->heap_binding;
		helper.version = qa->version;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_MIN_PRECISION_NATIVE_16BIT:
	{
		OptionMinPrecisionNative16Bit helper;
		auto *minprec = reinterpret_cast<const dxil_spv_option_min_precision_native_16bit *>(option);
		helper.enabled = minprec->enabled == DXIL_SPV_TRUE;
		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_I8_DOT:
	{
		OptionShaderI8Dot helper;
		helper.supported = bool(reinterpret_cast<const dxil_spv_option_shader_i8_dot *>(option)->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_RAY_TRACING_PRIMITIVE_CULLING:
	{
		OptionShaderRayTracingPrimitiveCulling helper;
		helper.supported = bool(reinterpret_cast<const dxil_spv_option_shader_ray_tracing_primitive_culling *>(option)->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_INVARIANT_POSITION:
	{
		OptionInvariantPosition helper;
		helper.enabled = bool(reinterpret_cast<const dxil_spv_option_invariant_position *>(option)->enabled);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SCALAR_BLOCK_LAYOUT:
	{
		OptionScalarBlockLayout helper;
		auto *opt = reinterpret_cast<const dxil_spv_option_scalar_block_layout *>(option);
		helper.supported = bool(opt->supported);
		helper.supports_per_component_robustness = bool(opt->supports_per_component_robustness);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BARYCENTRIC_KHR:
	{
		OptionBarycentricKHR helper;
		auto *opt = reinterpret_cast<const dxil_spv_option_barycentric_khr *>(option);
		helper.supported = bool(opt->supported);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_ROBUST_PHYSICAL_CBV_LOAD:
	{
		OptionRobustPhysicalCBVLoad helper;
		auto *robust = reinterpret_cast<const dxil_spv_option_robust_physical_cbv_load *>(option);
		helper.enabled = bool(robust->enabled);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_ARITHMETIC_RELAXED_PRECISION:
	{
		OptionArithmeticRelaxedPrecision helper;
		auto *robust = reinterpret_cast<const dxil_spv_option_arithmetic_relaxed_precision *>(option);
		helper.enabled = bool(robust->enabled);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_PHYSICAL_ADDRESS_DESCRIPTOR_INDEXING:
	{
		OptionPhysicalAddressDescriptorIndexing helper;
		auto *indexing = reinterpret_cast<const dxil_spv_option_physical_address_descriptor_indexing *>(option);
		helper.element_stride = indexing->element_stride;
		helper.element_offset = indexing->element_offset;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_FORCE_SUBGROUP_SIZE:
	{
		OptionForceSubgroupSize helper;
		auto *subgroup = reinterpret_cast<const dxil_spv_option_force_subgroup_size *>(option);
		helper.forced_value = subgroup->forced_value;
		helper.wave_size_enable = subgroup->wave_size_enable;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DENORM_PRESERVE_SUPPORT:
	{
		OptionDenormPreserveSupport helper;
		auto *denorm = reinterpret_cast<const dxil_spv_option_denorm_preserve_support *>(option);
		helper.support_float16_denorm_preserve = bool(denorm->supports_float16_denorm_preserve);
		helper.support_float64_denorm_preserve = bool(denorm->supports_float64_denorm_preserve);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_STRICT_HELPER_LANE_WAVE_OPS:
	{
		OptionStrictHelperLaneWaveOps helper;
		auto *strict = reinterpret_cast<const dxil_spv_option_strict_helper_lane_wave_ops *>(option);
		helper.enable = strict->enable;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SUBGROUP_PARTITIONED_NV:
	{
		OptionSubgroupPartitionedNV helper;
		auto *partitioned = reinterpret_cast<const dxil_spv_option_subgroup_partitioned_nv *>(option);
		helper.supported = partitioned->supported;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DEAD_CODE_ELIMINATE:
	{
		OptionDeadCodeEliminate helper;
		auto *eliminate = reinterpret_cast<const dxil_spv_option_dead_code_eliminate *>(option);
		helper.enabled = eliminate->enabled;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_PRECISE_CONTROL:
	{
		OptionPreciseControl helper;
		auto *precise = reinterpret_cast<const dxil_spv_option_precise_control *>(option);
		helper.force_precise = precise->force_precise;
		helper.propagate_precise = precise->propagate_precise;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SAMPLE_GRAD_OPTIMIZATION_CONTROL:
	{
		OptionSampleGradOptimizationControl helper;
		auto *precise = reinterpret_cast<const dxil_spv_option_sample_grad_optimization_control *>(option);
		helper.enabled = precise->enabled;
		helper.assume_uniform_scale = precise->assume_uniform_scale;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_OPACITY_MICROMAP:
	{
		OptionOpacityMicromap helper;
		auto *omm = reinterpret_cast<const dxil_spv_option_opacity_micromap *>(option);
		helper.enabled = omm->enabled;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_BRANCH_CONTROL:
	{
		OptionBranchControl helper;
		auto *branch = reinterpret_cast<const dxil_spv_option_branch_control *>(option);
		helper.use_shader_metadata = branch->use_shader_metadata;
		helper.force_branch = branch->force_branch;
		helper.force_loop = branch->force_loop;
		helper.force_unroll = branch->force_unroll;
		helper.force_flatten = branch->force_flatten;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SUBGROUP_PROPERTIES:
	{
		OptionSubgroupProperties helper;
		auto *sub = reinterpret_cast<const dxil_spv_option_subgroup_properties *>(option);
		helper.minimum_size = sub->minimum_size;
		helper.maximum_size = sub->maximum_size;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DESCRIPTOR_HEAP_ROBUSTNESS:
	{
		OptionDescriptorHeapRobustness helper;
		auto *rob = reinterpret_cast<const dxil_spv_option_descriptor_heap_robustness *>(option);
		helper.enabled = rob->enabled;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_COMPUTE_SHADER_DERIVATIVES_NV:
	{
		OptionComputeShaderDerivativesNV helper;
		auto *deriv = reinterpret_cast<const dxil_spv_option_compute_shader_derivatives_nv *>(option);
		helper.supported = deriv->supported;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_QUAD_CONTROL_RECONVERGENCE:
	{
		OptionQuadControlReconvergence helper;
		auto *quad = reinterpret_cast<const dxil_spv_option_quad_control_reconvergence *>(option);
		helper.supports_quad_control = quad->supports_quad_control;
		helper.supports_maximal_reconvergence = quad->supports_maximal_reconvergence;
		helper.force_maximal_reconvergence = quad->force_maximal_reconvergence;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_RAW_ACCESS_CHAINS_NV:
	{
		OptionRawAccessChainsNV helper;
		auto *chain = reinterpret_cast<const dxil_spv_option_raw_access_chains_nv *>(option);
		helper.supported = chain->supported;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_DRIVER_VERSION:
	{
		OptionDriverVersion helper;
		auto *ver = reinterpret_cast<const dxil_spv_option_driver_version *>(option);
		helper.driver_id = ver->driver_id;
		helper.driver_version = ver->driver_version;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_COMPUTE_SHADER_DERIVATIVES:
	{
		OptionComputeShaderDerivatives helper;
		auto *deriv = reinterpret_cast<const dxil_spv_option_compute_shader_derivatives *>(option);
		helper.supports_nv = deriv->supports_nv;
		helper.supports_khr = deriv->supports_khr;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_INSTRUCTION_INSTRUMENTATION:
	{
		OptionInstructionInstrumentation helper;
		auto *inst = reinterpret_cast<const dxil_spv_option_instruction_instrumentation *>(option);
		helper.enabled = inst->enabled;
		helper.version = inst->version;
		helper.control_desc_set = inst->control_desc_set;
		helper.control_binding = inst->control_binding;
		helper.payload_desc_set = inst->payload_desc_set;
		helper.payload_binding = inst->payload_binding;
		helper.shader_hash = inst->shader_hash;
		helper.type = InstructionInstrumentationType(inst->type);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_SHADER_QUIRK:
	{
		OptionShaderQuirk helper;
		auto *quirk = reinterpret_cast<const dxil_spv_option_shader_quirk *>(option);
		helper.quirk = static_cast<ShaderQuirk>(quirk->quirk);

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_EXTENDED_ROBUSTNESS:
	{
		OptionExtendedRobustness helper;
		auto *robust = reinterpret_cast<const dxil_spv_option_extended_robustness *>(option);
		helper.robust_group_shared = robust->robust_group_shared;
		helper.robust_alloca = robust->robust_alloca;
		helper.robust_constant_lut = robust->robust_constant_lut;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	case DXIL_SPV_OPTION_MAX_TESS_FACTOR:
	{
		OptionMaxTessFactor helper;
		auto *tess_factor = reinterpret_cast<const dxil_spv_option_max_tess_factor *>(option);
		helper.max_tess_factor = tess_factor->max_tess_factor;

		converter->options.emplace_back(duplicate(helper));
		break;
	}

	default:
		return DXIL_SPV_ERROR_UNSUPPORTED_FEATURE;
	}

	return DXIL_SPV_SUCCESS;
}